

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifAig.c
# Opt level: O2

Abc_Obj_t * Io_BlifParseConstruct_rec(Io_BlifMan_t *p,char *pName)

{
  char cVar1;
  Io_BlifObj_t *pIVar2;
  Vec_Ptr_t *p_00;
  uint uVar3;
  uint uVar4;
  Io_BlifObj_t **ppIVar5;
  Vec_Ptr_t *vTokens;
  char *pcVar6;
  Abc_Obj_t *pAVar7;
  size_t sVar8;
  char *pcVar9;
  Abc_Obj_t *p1;
  Abc_Obj_t *p1_00;
  ulong uVar10;
  char *__format;
  long lVar11;
  void *pvVar12;
  int iVar13;
  ulong uVar14;
  Abc_Aig_t *pMan;
  uint local_4c;
  
  ppIVar5 = Io_BlifHashLookup(p,pName);
  pIVar2 = *ppIVar5;
  if (pIVar2 == (Io_BlifObj_t *)0x0) {
    uVar3 = Io_BlifGetLine(p,pName);
    pcVar6 = "Line %d: Signal (%s) is not defined as a table.";
  }
  else {
    if ((*(uint *)pIVar2 & 0x20) == 0) {
      if ((Abc_Obj_t *)pIVar2->pEquiv != (Abc_Obj_t *)0x0) {
        return (Abc_Obj_t *)pIVar2->pEquiv;
      }
      *(uint *)pIVar2 = *(uint *)pIVar2 | 0x20;
      vTokens = Vec_PtrAlloc(8);
      Io_BlifCollectTokens(vTokens,pIVar2->pName + -(ulong)(*(uint *)pIVar2 >> 8),pIVar2->pName);
      uVar14 = 0;
      uVar10 = (ulong)(uint)vTokens->nSize;
      if (vTokens->nSize < 1) {
        uVar10 = uVar14;
      }
      for (; uVar10 != uVar14; uVar14 = uVar14 + 1) {
        pcVar6 = (char *)Vec_PtrEntry(vTokens,(int)uVar14);
        pAVar7 = Io_BlifParseConstruct_rec(p,pcVar6);
        if (pAVar7 == (Abc_Obj_t *)0x0) {
          Vec_PtrFree(vTokens);
          return (Abc_Obj_t *)0x0;
        }
        vTokens->pArray[uVar14] = pAVar7;
      }
      pcVar6 = pIVar2->pName;
      sVar8 = strlen(pcVar6);
      p->nTablesRead = p->nTablesRead + 1;
      Io_BlifSplitIntoTokens(p->vTokens,pcVar6 + sVar8,'.');
      p_00 = p->vTokens;
      if (p_00->nSize == 1) {
        pcVar6 = (char *)Vec_PtrEntry(p_00,0);
        if (((*pcVar6 - 0x30U & 0x8e) == 0) && (pcVar6[1] == '\0')) {
          pAVar7 = Abc_AigConst1(p->pAig);
          pvVar12 = (void *)((ulong)(*pcVar6 == '0') ^ (ulong)pAVar7);
        }
        else {
          uVar3 = Io_BlifGetLine(p,pcVar6);
          pcVar9 = "Line %d: Constant table has wrong output value (%s).";
LAB_002954cd:
          pvVar12 = (void *)0x0;
          sprintf(p->sError,pcVar9,(ulong)uVar3,pcVar6);
        }
      }
      else if (p_00->nSize == 0) {
        pAVar7 = Abc_AigConst1(p->pAig);
        pvVar12 = (void *)((ulong)pAVar7 ^ 1);
      }
      else {
        iVar13 = 0;
        pcVar6 = (char *)Vec_PtrEntry(p_00,0);
        if ((p->vTokens->nSize & 0x80000001U) != 1) {
          pAVar7 = Abc_AigConst1(p->pAig);
          pAVar7 = (Abc_Obj_t *)((ulong)pAVar7 ^ 1);
          local_4c = 0xffffffff;
LAB_00295548:
          if (p->vTokens->nSize / 2 <= iVar13) goto LAB_00295719;
          pcVar9 = (char *)Vec_PtrEntry(p->vTokens,iVar13 * 2);
          pcVar6 = (char *)Vec_PtrEntry(p->vTokens,iVar13 * 2 + 1);
          sVar8 = strlen(pcVar9);
          uVar3 = vTokens->nSize;
          if (sVar8 == uVar3) {
            uVar3 = (int)*pcVar6 - 0x30;
            if (((uVar3 & 0x8e) == 0) && (pcVar6[1] == '\0')) {
              uVar4 = uVar3;
              if ((local_4c == 0xffffffff) || (uVar4 = local_4c, local_4c == uVar3)) {
                local_4c = uVar4;
                p1 = Abc_AigConst1(p->pAig);
                lVar11 = 0;
                do {
                  cVar1 = pcVar9[lVar11];
                  if (cVar1 != '-') {
                    if (cVar1 == '0') {
                      pMan = (Abc_Aig_t *)p->pAig->pManFunc;
                      pvVar12 = Vec_PtrEntry(vTokens,(int)lVar11);
                      p1_00 = (Abc_Obj_t *)((ulong)pvVar12 ^ 1);
                    }
                    else {
                      if (cVar1 != '1') goto LAB_00295651;
                      pMan = (Abc_Aig_t *)p->pAig->pManFunc;
                      p1_00 = (Abc_Obj_t *)Vec_PtrEntry(vTokens,(int)lVar11);
                    }
                    p1 = Abc_AigAnd(pMan,p1,p1_00);
                  }
                  lVar11 = lVar11 + 1;
                } while( true );
              }
              uVar3 = Io_BlifGetLine(p,pcVar9);
              __format = 
              "Line %d: Output value (%s) differs from the value in the first line of the table (%d)."
              ;
              uVar10 = (ulong)uVar3;
              uVar14 = (ulong)local_4c;
              pcVar9 = pcVar6;
              goto LAB_002956af;
            }
            uVar3 = Io_BlifGetLine(p,pcVar9);
            pcVar9 = "Line %d: Output value (%s) is incorrect.";
            goto LAB_002954cd;
          }
          uVar4 = Io_BlifGetLine(p,pcVar9);
          __format = "Line %d: Cube (%s) has size different from the fanin count (%d).";
          uVar10 = (ulong)uVar4;
          uVar14 = (ulong)uVar3;
          goto LAB_002956af;
        }
        uVar3 = Io_BlifGetLine(p,pcVar6);
        pvVar12 = (void *)0x0;
        sprintf(p->sError,"Line %d: Table has odd number of tokens (%d).",(ulong)uVar3,
                (ulong)(uint)p->vTokens->nSize);
      }
      goto LAB_002956d2;
    }
    uVar3 = Io_BlifGetLine(p,pName);
    pcVar6 = "Line %d: Signal (%s) appears twice on a combinational path.";
  }
  sprintf(p->sError,pcVar6,(ulong)uVar3,pName);
  return (Abc_Obj_t *)0x0;
LAB_00295651:
  if (cVar1 == '\0') {
    pAVar7 = Abc_AigOr((Abc_Aig_t *)p->pAig->pManFunc,pAVar7,p1);
    iVar13 = iVar13 + 1;
    goto LAB_00295548;
  }
  uVar3 = Io_BlifGetLine(p,pcVar9);
  uVar14 = (ulong)(uint)(int)pcVar9[lVar11];
  __format = "Line %d: Product term (%s) contains character (%c).";
  uVar10 = (ulong)uVar3;
LAB_002956af:
  pvVar12 = (void *)0x0;
  sprintf(p->sError,__format,uVar10,pcVar9,uVar14);
  goto LAB_002956d2;
LAB_00295719:
  pvVar12 = (void *)((ulong)(local_4c == 0) ^ (ulong)pAVar7);
LAB_002956d2:
  pIVar2->pEquiv = pvVar12;
  Vec_PtrFree(vTokens);
  *(byte *)pIVar2 = *(byte *)pIVar2 & 0xdf;
  return (Abc_Obj_t *)pIVar2->pEquiv;
}

Assistant:

static Abc_Obj_t * Io_BlifParseConstruct_rec( Io_BlifMan_t * p, char * pName )
{
    Vec_Ptr_t * vFanins;
    Abc_Obj_t * pFaninAbc;
    Io_BlifObj_t * pObjIo;
    char * pNameFanin;
    int i;
    // get the IO object with this name
    pObjIo = *Io_BlifHashLookup( p, pName );
    if ( pObjIo == NULL )
    {
        sprintf( p->sError, "Line %d: Signal (%s) is not defined as a table.", Io_BlifGetLine(p, pName), pName );
        return NULL;
    }
    // loop detection
    if ( pObjIo->fLoop )
    {
        sprintf( p->sError, "Line %d: Signal (%s) appears twice on a combinational path.", Io_BlifGetLine(p, pName), pName );
        return NULL;
    }
    // check if the AIG is already constructed
    if ( pObjIo->pEquiv )
        return (Abc_Obj_t *)pObjIo->pEquiv;
    // mark this node on the path
    pObjIo->fLoop = 1;
    // construct the AIGs for the fanins
    vFanins = Vec_PtrAlloc( 8 );
    Io_BlifCollectTokens( vFanins, pObjIo->pName - pObjIo->Offset, pObjIo->pName );
    Vec_PtrForEachEntry( char *, vFanins, pNameFanin, i )
    {
        pFaninAbc = Io_BlifParseConstruct_rec( p, pNameFanin );
        if ( pFaninAbc == NULL )
        {
            Vec_PtrFree( vFanins );
            return NULL;
        }
        Vec_PtrWriteEntry( vFanins, i, pFaninAbc );
    }
    // construct the node
    pObjIo->pEquiv = Io_BlifParseTable( p, pObjIo->pName + strlen(pObjIo->pName), vFanins );
    Vec_PtrFree( vFanins );
    // unmark this node on the path
    pObjIo->fLoop = 0;
    // remember the new node
    return (Abc_Obj_t *)pObjIo->pEquiv;
}